

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_convolution_add(NetOptimize *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  value_type pLVar4;
  value_type pLVar5;
  value_type pLVar6;
  int *piVar7;
  long lVar8;
  FILE *__stream;
  bool bVar9;
  size_type sVar10;
  reference ppLVar11;
  reference pvVar12;
  size_type sVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool *pbVar16;
  reference pvVar17;
  long in_RDI;
  int top_blob_index_final;
  int i_1;
  float *bias;
  Mat bias_data;
  bool broadcasting_type_ok;
  int channels;
  MemoryData *memorydata;
  size_t k;
  BinaryOp *binaryop;
  Convolution *convolution;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  int local_144;
  Allocator *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  Mat *in_stack_fffffffffffffed8;
  int *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_118;
  long *local_108;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined8 local_e8;
  size_type local_d0;
  size_type local_b8;
  size_type local_a8;
  
  sVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                     (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_a8 = 0;
  do {
    if (sVar10 <= local_a8) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_a8);
    bVar9 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    if (!bVar9) {
      ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_a8);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar11)->tops,0);
      iVar1 = *pvVar12;
      local_b8 = local_a8;
      do {
        do {
          do {
            local_b8 = local_b8 + 1;
            if (sVar10 <= local_b8) goto LAB_00176e08;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_b8);
            bVar9 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          } while (bVar9);
          ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                               (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                 (in_RDI + 0x58),local_b8);
          sVar13 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar11)->bottoms);
        } while (sVar13 != 2);
        ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_b8);
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar11)->bottoms,0);
      } while (*pvVar12 != iVar1);
LAB_00176e08:
      if (local_b8 != sVar10) {
        ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_a8);
        pLVar4 = *ppLVar11;
        ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_b8);
        pLVar5 = *ppLVar11;
        if ((*(int *)&pLVar5[1]._vptr_Layer == 0) &&
           (*(int *)((long)&pLVar5[1]._vptr_Layer + 4) == 0)) {
          for (local_d0 = 0; local_d0 < local_b8; local_d0 = local_d0 + 1) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_d0);
            bVar9 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            if (!bVar9) {
              ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_d0);
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar11)->tops,0);
              iVar1 = *pvVar12;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar5->bottoms,1);
              if (iVar1 == *pvVar12) break;
            }
          }
          if (local_d0 != local_b8) {
            ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_d0);
            __stream = _stderr;
            pLVar6 = *ppLVar11;
            iVar1 = *(int *)&pLVar4[1]._vptr_Layer;
            bVar9 = false;
            if (((*(int *)&pLVar6[1]._vptr_Layer == iVar1) &&
                (*(int *)((long)&pLVar6[1]._vptr_Layer + 4) == 0)) &&
               (iVar2._0_1_ = pLVar6[1].support_bf16_storage,
               iVar2._1_1_ = pLVar6[1].support_fp16_storage,
               iVar2._2_1_ = pLVar6[1].support_int8_storage,
               iVar2._3_1_ = pLVar6[1].support_image_storage, iVar2 == 0)) {
              bVar9 = true;
            }
            if (((*(int *)&pLVar6[1]._vptr_Layer == 1) &&
                (*(int *)((long)&pLVar6[1]._vptr_Layer + 4) == 1)) &&
               (iVar3._0_1_ = pLVar6[1].support_bf16_storage,
               iVar3._1_1_ = pLVar6[1].support_fp16_storage,
               iVar3._2_1_ = pLVar6[1].support_int8_storage,
               iVar3._3_1_ = pLVar6[1].support_image_storage, iVar3 == iVar1)) {
              bVar9 = true;
            }
            if (bVar9) {
              uVar14 = std::__cxx11::string::c_str();
              uVar15 = std::__cxx11::string::c_str();
              fprintf(__stream,"fuse_convolution_add %s %s\n",uVar14,uVar15);
              ncnn::Mat::reshape(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                                 in_stack_fffffffffffffec8);
              if (*(int *)&pLVar4[1].type == 0) {
                *(undefined4 *)&pLVar4[1].type = 1;
                pbVar16 = &pLVar4[2].one_blob_only;
                if (pbVar16 != (bool *)&stack0xfffffffffffffed8) {
                  if (local_120 != (int *)0x0) {
                    LOCK();
                    *local_120 = *local_120 + 1;
                    UNLOCK();
                  }
                  lVar8._0_1_ = pLVar4[2].support_tensor_storage;
                  lVar8._1_1_ = pLVar4[2].support_reserved_00;
                  lVar8._2_1_ = pLVar4[2].support_reserved_0;
                  lVar8._3_1_ = pLVar4[2].support_reserved_1;
                  lVar8._4_1_ = pLVar4[2].support_reserved_2;
                  lVar8._5_1_ = pLVar4[2].support_reserved_3;
                  lVar8._6_1_ = pLVar4[2].support_reserved_4;
                  lVar8._7_1_ = pLVar4[2].support_reserved_5;
                  if (lVar8 != 0) {
                    piVar7 = *(int **)&pLVar4[2].support_tensor_storage;
                    LOCK();
                    iVar1 = *piVar7;
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (iVar1 == 1) {
                      if (*(long *)&pLVar4[2].typeindex == 0) {
                        if (*(void **)pbVar16 != (void *)0x0) {
                          free(*(void **)pbVar16);
                        }
                      }
                      else {
                        uVar14._0_1_ = pLVar4[2].one_blob_only;
                        uVar14._1_1_ = pLVar4[2].support_inplace;
                        uVar14._2_1_ = pLVar4[2].support_vulkan;
                        uVar14._3_1_ = pLVar4[2].support_packing;
                        uVar14._4_1_ = pLVar4[2].support_bf16_storage;
                        uVar14._5_1_ = pLVar4[2].support_fp16_storage;
                        uVar14._6_1_ = pLVar4[2].support_int8_storage;
                        uVar14._7_1_ = pLVar4[2].support_image_storage;
                        (**(code **)(**(long **)&pLVar4[2].typeindex + 0x18))
                                  (*(long **)&pLVar4[2].typeindex,uVar14);
                      }
                    }
                  }
                  pLVar4[2].one_blob_only = false;
                  pLVar4[2].support_inplace = false;
                  pLVar4[2].support_vulkan = false;
                  pLVar4[2].support_packing = false;
                  pLVar4[2].support_bf16_storage = false;
                  pLVar4[2].support_fp16_storage = false;
                  pLVar4[2].support_int8_storage = false;
                  pLVar4[2].support_image_storage = false;
                  pLVar4[2].support_reserved_6 = false;
                  pLVar4[2].support_reserved_7 = false;
                  pLVar4[2].support_reserved_8 = false;
                  pLVar4[2].support_reserved_9 = false;
                  pLVar4[2].support_reserved_10 = false;
                  pLVar4[2].support_reserved_11 = false;
                  pLVar4[2].support_reserved_12 = false;
                  pLVar4[2].support_reserved_13 = false;
                  *(undefined4 *)&pLVar4[2].userdata = 0;
                  *(undefined4 *)&pLVar4[2].type = 0;
                  *(undefined4 *)&pLVar4[2].type.field_0x4 = 0;
                  *(undefined4 *)&pLVar4[2].type._M_string_length = 0;
                  *(undefined4 *)((long)&pLVar4[2].type._M_string_length + 4) = 0;
                  *(undefined4 *)&pLVar4[2].type.field_2 = 0;
                  *(undefined8 *)((long)&pLVar4[2].type.field_2 + 8) = 0;
                  pLVar4[2].support_tensor_storage = false;
                  pLVar4[2].support_reserved_00 = false;
                  pLVar4[2].support_reserved_0 = false;
                  pLVar4[2].support_reserved_1 = false;
                  pLVar4[2].support_reserved_2 = false;
                  pLVar4[2].support_reserved_3 = false;
                  pLVar4[2].support_reserved_4 = false;
                  pLVar4[2].support_reserved_5 = false;
                  *(Mat **)pbVar16 = in_stack_fffffffffffffed8;
                  *(int **)&pLVar4[2].support_tensor_storage = local_120;
                  pLVar4[2].support_reserved_6 = (bool)local_118._M_allocated_capacity._0_1_;
                  pLVar4[2].support_reserved_7 = (bool)local_118._M_local_buf[1];
                  pLVar4[2].support_reserved_8 = (bool)local_118._M_local_buf[2];
                  pLVar4[2].support_reserved_9 = (bool)local_118._M_local_buf[3];
                  pLVar4[2].support_reserved_10 = (bool)local_118._M_local_buf[4];
                  pLVar4[2].support_reserved_11 = (bool)local_118._M_local_buf[5];
                  pLVar4[2].support_reserved_12 = (bool)local_118._M_local_buf[6];
                  pLVar4[2].support_reserved_13 = (bool)local_118._M_local_buf[7];
                  *(undefined4 *)&pLVar4[2].userdata = local_118._8_4_;
                  *(long **)&pLVar4[2].typeindex = local_108;
                  *(undefined4 *)&pLVar4[2].type = local_100;
                  *(undefined4 *)&pLVar4[2].type.field_0x4 = local_fc;
                  *(undefined4 *)&pLVar4[2].type._M_string_length = local_f8;
                  *(undefined4 *)((long)&pLVar4[2].type._M_string_length + 4) = local_f4;
                  *(undefined4 *)&pLVar4[2].type.field_2 = local_f0;
                  *(undefined8 *)((long)&pLVar4[2].type.field_2 + 8) = local_e8;
                }
              }
              else {
                lVar8 = *(long *)&pLVar4[2].one_blob_only;
                for (local_144 = 0; local_144 < iVar1; local_144 = local_144 + 1) {
                  *(float *)(lVar8 + (long)local_144 * 4) =
                       *(float *)(lVar8 + (long)local_144 * 4) +
                       *(float *)((long)&in_stack_fffffffffffffed8->data + (long)local_144 * 4);
                }
              }
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar5->tops,0);
              iVar1 = *pvVar12;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->tops,0);
              *pvVar12 = iVar1;
              pvVar17 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                  (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)
                                    (in_RDI + 0x50),(long)iVar1);
              pvVar17->producer = (int)local_a8;
              std::__cxx11::string::operator=((string *)&pLVar5->type,"ncnnfused");
              in_stack_fffffffffffffe50 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffed8;
              if (local_120 != (int *)0x0) {
                LOCK();
                iVar1 = *local_120;
                *local_120 = *local_120 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (local_108 == (long *)0x0) {
                    if (in_stack_fffffffffffffed8 != (Mat *)0x0) {
                      free(in_stack_fffffffffffffed8);
                    }
                  }
                  else {
                    (**(code **)(*local_108 + 0x18))(local_108,in_stack_fffffffffffffed8);
                  }
                }
              }
              *(undefined8 *)in_stack_fffffffffffffe50 = 0;
              (in_stack_fffffffffffffe50->field_2)._M_allocated_capacity = 0;
              *(undefined4 *)((long)&in_stack_fffffffffffffe50->field_2 + 8) = 0;
              *(undefined4 *)&in_stack_fffffffffffffe50[1]._M_string_length = 0;
              *(undefined4 *)((long)&in_stack_fffffffffffffe50[1]._M_string_length + 4) = 0;
              *(undefined4 *)&in_stack_fffffffffffffe50[1].field_2 = 0;
              *(undefined4 *)((long)&in_stack_fffffffffffffe50[1].field_2 + 4) = 0;
              *(undefined4 *)((long)&in_stack_fffffffffffffe50[1].field_2 + 8) = 0;
              *(undefined8 *)(in_stack_fffffffffffffe50 + 2) = 0;
              in_stack_fffffffffffffe50->_M_string_length = 0;
            }
          }
        }
      }
    }
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolution_add()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution")
            continue;

        // Convolution - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Convolution - BinaryOp to Convolution
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 0 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolution->num_output;

        bool broadcasting_type_ok = false;
        if (memorydata->w == channels && memorydata->h == 0 && memorydata->c == 0)
            broadcasting_type_ok = true;
        if (memorydata->w == 1 && memorydata->h == 1 && memorydata->c == channels)
            broadcasting_type_ok = true;

        if (!broadcasting_type_ok)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolution_add %s %s\n", convolution->name.c_str(), binaryop->name.c_str());

        ncnn::Mat bias_data = memorydata->data.reshape(channels);
        {
            if (convolution->bias_term == 0)
            {
                // init bias
                convolution->bias_term = 1;
                convolution->bias_data = bias_data;
            }
            else
            {
                float* bias = convolution->bias_data;
                for (int i = 0; i < channels; i++)
                {
                    bias[i] = bias[i] + bias_data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}